

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void select_statically(saucy *s,int *target,int *lmin,int *rmin)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  piVar2 = s->splitvar;
  iVar1 = (s->left).cfront[piVar2[s->lev]];
  *rmin = iVar1;
  *target = iVar1;
  iVar1 = (s->left).unlab[piVar2[s->lev]];
  *lmin = iVar1;
  iVar3 = *rmin;
  iVar4 = (s->right).clen[*target] + iVar3;
  lVar5 = (long)iVar3;
  while( true ) {
    if (iVar4 < iVar3) {
      return;
    }
    if ((s->right).lab[lVar5] == (s->left).lab[iVar1]) break;
    iVar3 = iVar3 + 1;
  }
  *rmin = iVar3;
  return;
}

Assistant:

static void
select_statically(struct saucy *s, int *target, int *lmin, int *rmin)
{
    int i;

    *target = *rmin = s->left.cfront[s->splitvar[s->lev]];
    *lmin = s->left.unlab[s->splitvar[s->lev]];
    /* try to map identically! */
    for (i = *rmin; i <= (*rmin + s->right.clen[*target]); i++)
        if (s->right.lab[*rmin] == s->left.lab[*lmin]) {
            *rmin = i;
            break;
        }
}